

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O1

int __thiscall fmt::v8::buffered_file::close(buffered_file *this,int __fd)

{
  int in_EAX;
  undefined8 uVar1;
  uint *puVar2;
  format_string<> fmt;
  
  if ((FILE *)this->file_ != (FILE *)0x0) {
    in_EAX = fclose((FILE *)this->file_);
    this->file_ = (FILE *)0x0;
    if (in_EAX != 0) {
      uVar1 = __cxa_allocate_exception(0x20);
      puVar2 = (uint *)__errno_location();
      fmt.str_.data_ = (char *)(ulong)*puVar2;
      fmt.str_.size_ = (size_t)"cannot close file";
      system_error<>((int)uVar1,fmt);
      __cxa_throw(uVar1,&std::system_error::typeinfo,std::system_error::~system_error);
    }
  }
  return in_EAX;
}

Assistant:

void buffered_file::close() {
  if (!file_) return;
  int result = FMT_SYSTEM(fclose(file_));
  file_ = nullptr;
  if (result != 0) FMT_THROW(system_error(errno, "cannot close file"));
}